

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O1

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_parseSettingsLine
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,char *line,int lineNumber)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  int iVar4;
  SPxOut *pSVar5;
  long lVar6;
  size_t sVar7;
  unsigned_long uVar8;
  ulong uVar9;
  long lVar10;
  Verbosity old_verbosity_7;
  char *pcVar11;
  ostream *poVar12;
  Verbosity old_verbosity_5;
  Verbosity old_verbosity_6;
  byte *pbVar13;
  undefined8 *puVar14;
  Verbosity old_verbosity;
  Verbosity VVar15;
  byte *__s1;
  Verbosity old_verbosity_2;
  byte *pbVar16;
  double value;
  string local_58;
  double local_38;
  
  for (; uVar9 = (ulong)(byte)*line, __s1 = (byte *)line, uVar9 < 0x24;
      line = (char *)((byte *)line + 1)) {
    if ((0x100002200U >> (uVar9 & 0x3f) & 1) == 0) {
      if ((0x800000401U >> (uVar9 & 0x3f) & 1) != 0) {
        return true;
      }
      break;
    }
  }
  do {
    do {
      pbVar16 = __s1;
      __s1 = pbVar16 + 1;
      uVar9 = (ulong)*pbVar16;
    } while (0x3a < uVar9);
    if ((0x900002601U >> (uVar9 & 0x3f) & 1) != 0) {
      *pbVar16 = 0;
      pbVar16 = __s1;
      goto LAB_005dacac;
    }
  } while (uVar9 != 0x3a);
  *pbVar16 = 0;
LAB_005dad04:
  do {
    uVar9 = (ulong)*__s1;
    pbVar16 = __s1;
    if (0x23 < uVar9) break;
    if ((0x100002200U >> (uVar9 & 0x3f) & 1) == 0) {
      if ((0x800000401U >> (uVar9 & 0x3f) & 1) != 0) {
        VVar15 = (this->spxout).m_verbosity;
        if ((int)VVar15 < 3) {
          return false;
        }
        (this->spxout).m_verbosity = INFO1;
        poVar12 = (this->spxout).m_streams[3];
        pcVar11 = "Error parsing settings file: no parameter name in line ";
        lVar10 = 0x37;
        goto LAB_005dad4d;
      }
      break;
    }
    __s1 = __s1 + 1;
  } while( true );
  while (uVar9 != 0x3d) {
    do {
      pbVar13 = pbVar16;
      pbVar16 = pbVar13 + 1;
      uVar9 = (ulong)*pbVar13;
    } while (0x3d < uVar9);
    if ((0x900002601U >> (uVar9 & 0x3f) & 1) != 0) {
      *pbVar13 = 0;
      pbVar13 = pbVar16;
      goto LAB_005dadbe;
    }
  }
  *pbVar13 = 0;
LAB_005dae09:
  do {
    uVar9 = (ulong)*pbVar16;
    pbVar13 = pbVar16;
    if (0x23 < uVar9) goto LAB_005dae89;
    if ((0x100002200U >> (uVar9 & 0x3f) & 1) == 0) {
      if ((0x800000401U >> (uVar9 & 0x3f) & 1) != 0) {
        VVar15 = (this->spxout).m_verbosity;
        if ((int)VVar15 < 3) {
          return false;
        }
        pSVar5 = &this->spxout;
        (this->spxout).m_verbosity = INFO1;
        pcVar11 = "Error parsing settings file: no parameter value in line ";
        goto LAB_005dae49;
      }
      goto LAB_005dae89;
    }
    pbVar16 = pbVar16 + 1;
  } while( true );
  while ((bVar1 == 9 || (bVar1 == 0xd))) {
LAB_005dadbe:
    pbVar16 = pbVar13 + 1;
    bVar1 = *pbVar13;
    pbVar13 = pbVar16;
    if (0x1f < bVar1) {
      if (bVar1 != 0x20) {
        if (bVar1 == 0x3d) goto LAB_005dae09;
        break;
      }
      goto LAB_005dadbe;
    }
  }
  VVar15 = (this->spxout).m_verbosity;
  if ((int)VVar15 < 3) {
    return false;
  }
  pSVar5 = &this->spxout;
  (this->spxout).m_verbosity = INFO1;
  pcVar11 = "Error parsing settings file: no \'=\' after parameter name in line ";
  goto LAB_005dae49;
LAB_005daea9:
  uVar9 = (ulong)*pbVar13;
  if (0x23 < uVar9) goto LAB_005dafbb;
  if ((0x100002200U >> (uVar9 & 0x3f) & 1) == 0) {
    if ((0x800000401U >> (uVar9 & 0x3f) & 1) != 0) goto LAB_005daed7;
    goto LAB_005dafbb;
  }
  pbVar13 = pbVar13 + 1;
  goto LAB_005daea9;
LAB_005dafbb:
  VVar15 = (this->spxout).m_verbosity;
  if ((int)VVar15 < 3) {
    return false;
  }
  (this->spxout).m_verbosity = INFO1;
  pSVar5 = soplex::operator<<(&this->spxout,"Error parsing settings file: additional character \'");
  local_58._M_dataplus._M_p._0_1_ = *pbVar13;
  std::__ostream_insert<char,std::char_traits<char>>
            (pSVar5->m_streams[pSVar5->m_verbosity],(char *)&local_58,1);
  pcVar11 = "\' after parameter value in line ";
  goto LAB_005dae49;
  while ((bVar1 == 9 || (bVar1 == 0xd))) {
LAB_005dacac:
    __s1 = pbVar16 + 1;
    bVar1 = *pbVar16;
    pbVar16 = __s1;
    if (0x1f < bVar1) {
      if (bVar1 != 0x20) {
        if (bVar1 == 0x3a) goto LAB_005dad04;
        break;
      }
      goto LAB_005dacac;
    }
  }
  VVar15 = (this->spxout).m_verbosity;
  if ((int)VVar15 < 3) {
    return false;
  }
  (this->spxout).m_verbosity = INFO1;
  poVar12 = (this->spxout).m_streams[3];
  pcVar11 = "Error parsing settings file: no \':\' separating parameter type and name in line ";
  lVar10 = 0x4f;
LAB_005dad4d:
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar11,lVar10);
  std::ostream::operator<<
            ((ostream *)(this->spxout).m_streams[(this->spxout).m_verbosity],lineNumber);
  std::__ostream_insert<char,std::char_traits<char>>
            ((this->spxout).m_streams[(this->spxout).m_verbosity],".\n",2);
  (this->spxout).m_verbosity = VVar15;
  return false;
  while (uVar9 != 0) {
LAB_005dae89:
    do {
      pbVar2 = pbVar13;
      pbVar13 = pbVar2 + 1;
      uVar9 = (ulong)*pbVar2;
    } while (0x23 < uVar9);
    if ((0x900002600U >> (uVar9 & 0x3f) & 1) != 0) {
      *pbVar2 = 0;
      goto LAB_005daea9;
    }
  }
LAB_005daed7:
  iVar4 = strncmp(line,"bool",4);
  if (iVar4 == 0) {
    puVar14 = &SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
               ::Settings::boolParam;
    lVar10 = 0;
    do {
      iVar4 = strncmp((char *)__s1,(char *)*puVar14,500);
      if (iVar4 == 0) {
        iVar4 = strncasecmp((char *)pbVar16,"true",4);
        bVar3 = true;
        if (iVar4 != 0) {
          iVar4 = strncasecmp((char *)pbVar16,"TRUE",4);
          bVar3 = true;
          if (iVar4 != 0) {
            iVar4 = strncasecmp((char *)pbVar16,"t",4);
            bVar3 = true;
            if (iVar4 != 0) {
              iVar4 = strncasecmp((char *)pbVar16,"T",4);
              bVar3 = true;
              if (iVar4 != 0) {
                lVar6 = strtol((char *)pbVar16,(char **)0x0,4);
                bVar3 = true;
                if (lVar6 != 1) {
                  iVar4 = strncasecmp((char *)pbVar16,"false",5);
                  if ((((iVar4 != 0) && (iVar4 = strncasecmp((char *)pbVar16,"FALSE",5), iVar4 != 0)
                       ) && (iVar4 = strncasecmp((char *)pbVar16,"f",5), iVar4 != 0)) &&
                     ((iVar4 = strncasecmp((char *)pbVar16,"F",5), iVar4 != 0 &&
                      (lVar6 = strtol((char *)pbVar16,(char **)0x0,5), lVar6 != 0))))
                  goto LAB_005db169;
                  bVar3 = false;
                }
              }
            }
          }
        }
        bVar3 = setBoolParam(this,(BoolParam)lVar10,bVar3,true);
        if (bVar3) {
          return true;
        }
LAB_005db169:
        VVar15 = (this->spxout).m_verbosity;
        if ((int)VVar15 < 3) {
          return false;
        }
        (this->spxout).m_verbosity = INFO1;
        pSVar5 = soplex::operator<<(&this->spxout,"Error parsing settings file: invalid value <");
        pSVar5 = soplex::operator<<(pSVar5,(char *)pbVar16);
        pSVar5 = soplex::operator<<(pSVar5,"> for bool parameter <");
        pSVar5 = soplex::operator<<(pSVar5,(char *)__s1);
        pSVar5 = soplex::operator<<(pSVar5,"> in line ");
        std::ostream::operator<<((ostream *)pSVar5->m_streams[pSVar5->m_verbosity],lineNumber);
        soplex::operator<<(pSVar5,".\n");
        (this->spxout).m_verbosity = VVar15;
        return false;
      }
      lVar10 = lVar10 + 1;
      puVar14 = puVar14 + 4;
    } while (lVar10 != 0x1a);
LAB_005db21f:
    VVar15 = (this->spxout).m_verbosity;
    if ((int)VVar15 < 3) {
      return false;
    }
    pSVar5 = &this->spxout;
    (this->spxout).m_verbosity = INFO1;
    pcVar11 = "Error parsing settings file: unknown parameter name <";
  }
  else {
    iVar4 = strncmp(line,"int",3);
    if (iVar4 == 0) {
      puVar14 = &SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                 ::Settings::intParam;
      lVar10 = 0;
      do {
        iVar4 = strncmp((char *)__s1,(char *)*puVar14,500);
        if (iVar4 == 0) {
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          sVar7 = strlen((char *)pbVar16);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,pbVar16,pbVar16 + sVar7);
          iVar4 = std::__cxx11::stoi(&local_58,(size_t *)0x0,10);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          bVar3 = setIntParam(this,(IntParam)lVar10,iVar4,false);
          if (bVar3) {
            return bVar3;
          }
          VVar15 = (this->spxout).m_verbosity;
          if ((int)VVar15 < 3) {
            return bVar3;
          }
          (this->spxout).m_verbosity = INFO1;
          pSVar5 = soplex::operator<<(&this->spxout,"Error parsing settings file: invalid value <");
          pSVar5 = soplex::operator<<(pSVar5,(char *)pbVar16);
          pcVar11 = "> for int parameter <";
          goto LAB_005db3e7;
        }
        lVar10 = lVar10 + 1;
        puVar14 = puVar14 + 4;
      } while (lVar10 != 0x1c);
      goto LAB_005db21f;
    }
    iVar4 = strncmp(line,"real",4);
    if (iVar4 == 0) {
      puVar14 = &SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                 ::Settings::realParam;
      lVar10 = 0;
      do {
        iVar4 = strncmp((char *)__s1,(char *)*puVar14,500);
        if (iVar4 == 0) {
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          sVar7 = strlen((char *)pbVar16);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,pbVar16,pbVar16 + sVar7);
          value = std::__cxx11::stod(&local_58,(size_t *)0x0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            local_38 = value;
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            value = local_38;
          }
          bVar3 = setRealParam(this,(RealParam)lVar10,value,true);
          if (bVar3) {
            return bVar3;
          }
          VVar15 = (this->spxout).m_verbosity;
          if ((int)VVar15 < 3) {
            return bVar3;
          }
          (this->spxout).m_verbosity = INFO1;
          pSVar5 = soplex::operator<<(&this->spxout,"Error parsing settings file: invalid value <");
          pSVar5 = soplex::operator<<(pSVar5,(char *)pbVar16);
          pcVar11 = "> for R parameter <";
LAB_005db3e7:
          pSVar5 = soplex::operator<<(pSVar5,pcVar11);
          pSVar5 = soplex::operator<<(pSVar5,(char *)__s1);
          pSVar5 = soplex::operator<<(pSVar5,"> in line ");
          std::ostream::operator<<((ostream *)pSVar5->m_streams[pSVar5->m_verbosity],lineNumber);
          soplex::operator<<(pSVar5,".\n");
          (this->spxout).m_verbosity = VVar15;
          return bVar3;
        }
        lVar10 = lVar10 + 1;
        puVar14 = puVar14 + 4;
      } while (lVar10 != 0x1b);
      goto LAB_005db21f;
    }
    iVar4 = strncmp(line,"uint",4);
    if (iVar4 == 0) {
      iVar4 = strncmp((char *)__s1,"random_seed",0xb);
      if (iVar4 == 0) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        sVar7 = strlen((char *)pbVar16);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pbVar16,pbVar16 + sVar7)
        ;
        uVar8 = std::__cxx11::stoul(&local_58,(size_t *)0x0,10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        if (uVar8 >> 0x20 != 0) {
          VVar15 = (this->spxout).m_verbosity;
          uVar8 = 0xffffffff;
          if (0 < (int)VVar15) {
            (this->spxout).m_verbosity = WARNING;
            soplex::operator<<(&this->spxout,"Converting number greater than UINT_MAX to uint.\n");
            (this->spxout).m_verbosity = VVar15;
          }
        }
        setRandomSeed(this,(uint)uVar8);
        return true;
      }
      VVar15 = (this->spxout).m_verbosity;
      if ((int)VVar15 < 3) {
        return false;
      }
      (this->spxout).m_verbosity = INFO1;
      soplex::operator<<(&this->spxout,
                         "Error parsing settings file for uint parameter <random_seed>.\n");
      (this->spxout).m_verbosity = VVar15;
      return false;
    }
    VVar15 = (this->spxout).m_verbosity;
    if ((int)VVar15 < 3) {
      return false;
    }
    (this->spxout).m_verbosity = INFO1;
    pSVar5 = soplex::operator<<(&this->spxout,
                                "Error parsing settings file: invalid parameter type <");
    pSVar5 = soplex::operator<<(pSVar5,line);
    pcVar11 = "> for parameter <";
  }
  pSVar5 = soplex::operator<<(pSVar5,pcVar11);
  pSVar5 = soplex::operator<<(pSVar5,(char *)__s1);
  pcVar11 = "> in line ";
LAB_005dae49:
  pSVar5 = soplex::operator<<(pSVar5,pcVar11);
  std::ostream::operator<<((ostream *)pSVar5->m_streams[pSVar5->m_verbosity],lineNumber);
  soplex::operator<<(pSVar5,".\n");
  (this->spxout).m_verbosity = VVar15;
  return false;
}

Assistant:

bool SoPlexBase<R>::_parseSettingsLine(char* line, const int lineNumber)
{
   assert(line != nullptr);

   bool success = true;

   // find the start of the parameter type
   while(*line == ' ' || *line == '\t' || *line == '\r')
      line++;

   if(*line == '\0' || *line == '\n' || *line == '#')
      return true;

   char* paramTypeString = line;

   // find the end of the parameter type
   while(*line != ' ' && *line != '\t' && *line != '\r' && *line != '\n' && *line != '#'
         && *line != '\0' && *line != ':')
      line++;

   if(*line == ':')
   {
      *line = '\0';
      line++;
   }
   else
   {
      *line = '\0';
      line++;

      // search for the ':' char in the line
      while(*line == ' ' || *line == '\t' || *line == '\r')
         line++;

      if(*line != ':')
      {
         SPX_MSG_INFO1(spxout, spxout <<
                       "Error parsing settings file: no ':' separating parameter type and name in line " << lineNumber <<
                       ".\n");
         return false;
      }

      line++;
   }

   // find the start of the parameter name
   while(*line == ' ' || *line == '\t' || *line == '\r')
      line++;

   if(*line == '\0' || *line == '\n' || *line == '#')
   {
      SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: no parameter name in line " <<
                    lineNumber << ".\n");
      return false;
   }

   char* paramName = line;

   // find the end of the parameter name
   while(*line != ' ' && *line != '\t' && *line != '\r' && *line != '\n' && *line != '#'
         && *line != '\0' && *line != '=')
      line++;

   if(*line == '=')
   {
      *line = '\0';
      line++;
   }
   else
   {
      *line = '\0';
      line++;

      // search for the '=' char in the line
      while(*line == ' ' || *line == '\t' || *line == '\r')
         line++;

      if(*line != '=')
      {
         SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: no '=' after parameter name in line "
                       << lineNumber << ".\n");
         return false;
      }

      line++;
   }

   // find the start of the parameter value string
   while(*line == ' ' || *line == '\t' || *line == '\r')
      line++;

   if(*line == '\0' || *line == '\n' || *line == '#')
   {
      SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: no parameter value in line " <<
                    lineNumber << ".\n");
      return false;
   }

   char* paramValueString = line;

   // find the end of the parameter value string
   while(*line != ' ' && *line != '\t' && *line != '\r' && *line != '\n' && *line != '#'
         && *line != '\0')
      line++;

   if(*line != '\0')
   {
      // check, if the rest of the line is clean
      *line = '\0';
      line++;

      while(*line == ' ' || *line == '\t' || *line == '\r')
         line++;

      if(*line != '\0' && *line != '\n' && *line != '#')
      {
         SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: additional character '" << *line <<
                       "' after parameter value in line " << lineNumber << ".\n");
         return false;
      }
   }

   // check whether we have a bool parameter
   if(strncmp(paramTypeString, "bool", 4) == 0)
   {
      for(int param = 0; ; param++)
      {
         if(param >= SoPlexBase<R>::BOOLPARAM_COUNT)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: unknown parameter name <" << paramName
                          << "> in line " << lineNumber << ".\n");
            return false;
         }
         else if(strncmp(paramName, _currentSettings->boolParam.name[param].c_str(),
                         SPX_SET_MAX_LINE_LEN) == 0)
         {
            if(strncasecmp(paramValueString, "true", 4) == 0
                  || strncasecmp(paramValueString, "TRUE", 4) == 0
                  || strncasecmp(paramValueString, "t", 4) == 0
                  || strncasecmp(paramValueString, "T", 4) == 0
                  || strtol(paramValueString, nullptr, 4) == 1)
               success = setBoolParam((SoPlexBase<R>::BoolParam)param, true);
            else if(strncasecmp(paramValueString, "false", 5) == 0
                    || strncasecmp(paramValueString, "FALSE", 5) == 0
                    || strncasecmp(paramValueString, "f", 5) == 0
                    || strncasecmp(paramValueString, "F", 5) == 0
                    || strtol(paramValueString, nullptr, 5) == 0)
               success = setBoolParam((SoPlexBase<R>::BoolParam)param, false);
            else
               success = false;

            if(success)
               break;
            else
            {
               SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: invalid value <" << paramValueString
                             << "> for bool parameter <" << paramName << "> in line " << lineNumber << ".\n");
               return false;
            }
         }
      }

      return true;
   }

   // check whether we have an integer parameter
   if(strncmp(paramTypeString, "int", 3) == 0)
   {
      for(int param = 0; ; param++)
      {
         if(param >= SoPlexBase<R>::INTPARAM_COUNT)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: unknown parameter name <" << paramName
                          << "> in line " << lineNumber << ".\n");
            return false;
         }
         else if(strncmp(paramName, _currentSettings->intParam.name[param].c_str(),
                         SPX_SET_MAX_LINE_LEN) == 0)
         {
            int value;
            value = std::stoi(paramValueString);

            if(setIntParam((SoPlexBase<R>::IntParam)param, value, false))
               break;
            else
            {
               SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: invalid value <" << paramValueString
                             << "> for int parameter <" << paramName << "> in line " << lineNumber << ".\n");
               return false;
            }
         }
      }

      return true;
   }

   // check whether we have a R parameter
   if(strncmp(paramTypeString, "real", 4) == 0)
   {
      for(int param = 0; ; param++)
      {
         if(param >= SoPlexBase<R>::REALPARAM_COUNT)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: unknown parameter name <" << paramName
                          << "> in line " << lineNumber << ".\n");
            return false;
         }
         else if(strncmp(paramName, _currentSettings->realParam.name[param].c_str(),
                         SPX_SET_MAX_LINE_LEN) == 0)
         {
            Real value;

#ifdef WITH_LONG_DOUBLE
            value = std::stold(paramValueString);
#else
#ifdef WITH_FLOAT
            value = std::stof(paramValueString);
#else
            value = std::stod(paramValueString);
#endif
#endif

            if(setRealParam((SoPlexBase<R>::RealParam)param, value))
               break;
            else
            {
               SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: invalid value <" << paramValueString
                             << "> for R parameter <" << paramName << "> in line " << lineNumber << ".\n");
               return false;
            }
         }
      }

      return true;
   }

#ifdef SOPLEX_WITH_RATIONALPARAM

   // check whether we have a rational parameter
   if(strncmp(paramTypeString, "rational", 8) == 0)
   {
      for(int param = 0; ; param++)
      {
         if(param >= SoPlexBase<R>::RATIONALPARAM_COUNT)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: unknown parameter name <" << paramName
                          << "> in line " << lineNumber << ".\n");
            return false;
         }
         else if(strncmp(paramName, _currentSettings->rationalParam.name[param].c_str(),
                         SPX_SET_MAX_LINE_LEN) == 0)
         {
            Rational value;

            if(readStringRational(paramValueString, value)
                  && setRationalParam((SoPlexBase<R>::RationalParam)param, value))
               break;
            else
            {
               SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: invalid value <" << paramValueString
                             << "> for rational parameter <" << paramName << "> in line " << lineNumber << ".\n");
               return false;
            }
         }
      }

      return true;
   }

#endif

   // check whether we have the random seed
   if(strncmp(paramTypeString, "uint", 4) == 0)
   {
      if(strncmp(paramName, "random_seed", 11) == 0)
      {
         unsigned int value;
         unsigned long parseval;

         parseval = std::stoul(paramValueString);

         if(parseval > UINT_MAX)
         {
            value = UINT_MAX;
            SPX_MSG_WARNING(spxout, spxout << "Converting number greater than UINT_MAX to uint.\n");
         }
         else
            value = (unsigned int) parseval;

         setRandomSeed(value);
         return true;
      }

      SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file for uint parameter <random_seed>.\n");
      return false;
   }

   SPX_MSG_INFO1(spxout, spxout << "Error parsing settings file: invalid parameter type <" <<
                 paramTypeString << "> for parameter <" << paramName << "> in line " << lineNumber << ".\n");

   return false;
}